

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaCompareValuesInternal
              (xmlSchemaValType xtype,xmlSchemaValPtr x,xmlChar *xvalue,
              xmlSchemaWhitespaceValueType xws,xmlSchemaValType ytype,xmlSchemaValPtr y,
              xmlChar *yvalue,xmlSchemaWhitespaceValueType yws)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  xmlSchemaValPtr pxVar5;
  xmlSchemaValPtr pxVar6;
  long lVar7;
  xmlGenericErrorFunc *pp_Var8;
  void **ppvVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  undefined8 uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  xmlGenericErrorFunc p_Var17;
  xmlChar *pxVar18;
  byte *pbVar19;
  uint uVar20;
  uint uVar21;
  void *pvVar22;
  uint uVar23;
  xmlChar *pxVar24;
  uint uVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  xmlSchemaValPtr local_40;
  xmlSchemaValPtr local_38;
  
  if (0x2d < xtype - XML_SCHEMAS_STRING) {
    return -2;
  }
  uVar14 = (ulong)ytype;
  switch(xtype) {
  case XML_SCHEMAS_STRING:
  case XML_SCHEMAS_NORMSTRING:
  case XML_SCHEMAS_TOKEN:
  case XML_SCHEMAS_LANGUAGE:
  case XML_SCHEMAS_NMTOKEN:
  case XML_SCHEMAS_NAME:
  case XML_SCHEMAS_NCNAME:
  case XML_SCHEMAS_ID:
  case XML_SCHEMAS_IDREF:
  case XML_SCHEMAS_ENTITY:
  case XML_SCHEMAS_ANYURI:
  case XML_SCHEMAS_ANYSIMPLETYPE:
    if (x != (xmlSchemaValPtr)0x0) {
      xvalue = (x->value).qname.name;
    }
    if (y != (xmlSchemaValPtr)0x0) {
      yvalue = (y->value).qname.name;
    }
    if (XML_SCHEMAS_ANYSIMPLETYPE < ytype) {
      return -2;
    }
    if ((0x400025d70006U >> (uVar14 & 0x3f) & 1) != 0) {
      if (xws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
        if (yws == XML_SCHEMA_WHITESPACE_PRESERVE) {
          iVar3 = 1;
          pbVar19 = xvalue;
          xvalue = yvalue;
LAB_001c964e:
          iVar3 = xmlSchemaComparePreserveCollapseStrings(xvalue,pbVar19,iVar3);
          return iVar3;
        }
        if (yws != XML_SCHEMA_WHITESPACE_REPLACE) {
          if (yws != XML_SCHEMA_WHITESPACE_COLLAPSE) {
            return -2;
          }
          while ((uVar14 = (ulong)*xvalue, uVar14 < 0x21 &&
                 ((0x100002600U >> (uVar14 & 0x3f) & 1) != 0))) {
            xvalue = xvalue + 1;
          }
          while (((ulong)*yvalue < 0x21 && ((0x100002600U >> ((ulong)*yvalue & 0x3f) & 1) != 0))) {
            yvalue = yvalue + 1;
          }
          while( true ) {
            bVar1 = *yvalue;
            uVar10 = (ulong)bVar1;
            bVar11 = (byte)uVar14;
            if (bVar11 == 0) {
              if (bVar1 == 0) {
                return 0;
              }
              while( true ) {
                yvalue = yvalue + 1;
                if (0x20 < (byte)uVar10) {
                  return -1;
                }
                if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
                uVar10 = (ulong)*yvalue;
              }
              if (uVar10 != 0) {
                return -1;
              }
              return 0;
            }
            if (bVar1 == 0) break;
            if ((bVar11 < 0x21) && ((0x100002600U >> (uVar14 & 0x3f) & 1) != 0)) {
              if ((0x20 < bVar1) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) {
                return (int)uVar14 - (uint)bVar1;
              }
              while (((byte)uVar14 < 0x21 && ((0x100002600U >> (uVar14 & 0x3f) & 1) != 0))) {
                pbVar19 = xvalue + 1;
                xvalue = xvalue + 1;
                uVar14 = (ulong)*pbVar19;
              }
              while (((byte)uVar10 < 0x21 && ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0))) {
                pbVar19 = yvalue + 1;
                yvalue = yvalue + 1;
                uVar10 = (ulong)*pbVar19;
              }
            }
            else {
              if (bVar11 < bVar1) {
                return -1;
              }
              if (bVar11 != bVar1) {
                return 1;
              }
              yvalue = yvalue + 1;
              uVar14 = (ulong)xvalue[1];
              xvalue = xvalue + 1;
            }
          }
          while( true ) {
            xvalue = xvalue + 1;
            if (0x20 < (byte)uVar14) {
              return 1;
            }
            if ((0x100002600U >> (uVar14 & 0x3f) & 1) == 0) break;
            uVar14 = (ulong)*xvalue;
          }
          if (uVar14 == 0) {
            return 0;
          }
          return 1;
        }
        iVar3 = 1;
        pbVar19 = xvalue;
        xvalue = yvalue;
LAB_001c9611:
        iVar3 = xmlSchemaCompareReplaceCollapseStrings(xvalue,pbVar19,iVar3);
        return iVar3;
      }
      if (xws == XML_SCHEMA_WHITESPACE_REPLACE) {
        if (yws != XML_SCHEMA_WHITESPACE_PRESERVE) {
          if (yws != XML_SCHEMA_WHITESPACE_COLLAPSE) {
            if (yws != XML_SCHEMA_WHITESPACE_REPLACE) {
              return -2;
            }
            lVar7 = 0;
            do {
              bVar1 = xvalue[lVar7];
              bVar11 = yvalue[lVar7];
              if (bVar1 == 0) {
                return -(uint)(bVar11 != 0);
              }
              uVar25 = (uint)bVar1;
              if (bVar11 < 0x21) {
                if ((0x100002600U >> ((ulong)bVar11 & 0x3f) & 1) == 0) {
                  if ((ulong)bVar11 == 0) {
                    return 1;
                  }
                  goto LAB_001c92cd;
                }
                if ((0x20 < uVar25) || ((0x100002600U >> ((ulong)uVar25 & 0x3f) & 1) == 0)) {
                  bVar26 = bVar1 < 0x20;
                  goto LAB_001c974b;
                }
              }
              else {
LAB_001c92cd:
                if ((uVar25 < 0x21) && ((0x100002600U >> ((ulong)uVar25 & 0x3f) & 1) != 0)) {
                  bVar26 = bVar11 < 0x21;
                  goto LAB_001c97a4;
                }
                if (bVar1 < bVar11) {
                  return -1;
                }
                if (bVar1 != bVar11) {
                  return 1;
                }
              }
              lVar7 = lVar7 + 1;
            } while( true );
          }
          iVar3 = 0;
          pbVar19 = yvalue;
          goto LAB_001c9611;
        }
        iVar3 = 1;
        pbVar19 = xvalue;
        xvalue = yvalue;
      }
      else {
        if (xws != XML_SCHEMA_WHITESPACE_PRESERVE) {
          return -2;
        }
        if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
          iVar3 = 0;
          pbVar19 = yvalue;
          goto LAB_001c964e;
        }
        if (yws != XML_SCHEMA_WHITESPACE_REPLACE) {
          if (yws != XML_SCHEMA_WHITESPACE_PRESERVE) {
            return -2;
          }
          iVar3 = xmlStrEqual(xvalue,yvalue);
          uVar25 = (uint)(iVar3 == 0);
          goto LAB_001c922b;
        }
        iVar3 = 0;
        pbVar19 = yvalue;
      }
      iVar3 = xmlSchemaComparePreserveReplaceStrings(xvalue,pbVar19,iVar3);
      return iVar3;
    }
    if (uVar14 != 0x15) {
      return -2;
    }
    pp_Var8 = __xmlGenericError();
    p_Var17 = *pp_Var8;
    ppvVar9 = __xmlGenericErrorContext();
    pvVar22 = *ppvVar9;
    uVar13 = 0x1306;
    goto LAB_001c9499;
  default:
    if (y != (xmlSchemaValPtr)0x0 && x != (xmlSchemaValPtr)0x0) {
      if (ytype != xtype) {
        if (XML_SCHEMAS_UBYTE < ytype) {
          return -2;
        }
        if ((0x7ffc0000008U >> (uVar14 & 0x3f) & 1) == 0) {
          return -2;
        }
      }
      iVar3 = xmlSchemaCompareDecimals(x,y);
      return iVar3;
    }
    break;
  case XML_SCHEMAS_TIME:
  case XML_SCHEMAS_GDAY:
  case XML_SCHEMAS_GMONTH:
  case XML_SCHEMAS_GMONTHDAY:
  case XML_SCHEMAS_GYEAR:
  case XML_SCHEMAS_GYEARMONTH:
  case XML_SCHEMAS_DATE:
  case XML_SCHEMAS_DATETIME:
    if (7 < ytype - XML_SCHEMAS_TIME) {
      return -2;
    }
    if (x == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if (y == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if ((x->value).decimal.lo + 0xffa6784e56bb741b < 0xff4cf09cad76e837) {
      return -2;
    }
    if ((y->value).decimal.lo + 0xffa6784e56bb741b < 0xff4cf09cad76e837) {
      return -2;
    }
    uVar2 = *(ushort *)((long)&y->value + 0x18);
    if ((*(byte *)((long)&x->value + 0x18) & 1) == 0) {
      if ((uVar2 & 1) == 0) goto LAB_001c98c8;
      pxVar5 = xmlSchemaDateNormalize(y,0.0);
      lVar7 = _xmlSchemaDateCastYMToDays(pxVar5);
      lVar7 = (ulong)((pxVar5->value).hex.total >> 4 & 0x1f) + lVar7;
      pxVar6 = xmlSchemaDateNormalize(x,-50400.0);
      lVar15 = _xmlSchemaDateCastYMToDays(pxVar6);
      uVar25 = (pxVar6->value).hex.total;
      lVar15 = (ulong)(uVar25 >> 4 & 0x1f) + lVar15;
      local_40 = pxVar5;
      if (lVar15 < lVar7) {
LAB_001c96c1:
        xmlSchemaFreeValue(pxVar6);
        xmlSchemaFreeValue(local_40);
        return -1;
      }
      if (lVar15 != lVar7) {
LAB_001c98b8:
        xmlSchemaFreeValue(pxVar6);
        xmlSchemaFreeValue(local_40);
        goto LAB_001c98c8;
      }
      uVar12 = (pxVar5->value).hex.total;
      if ((double)(int)((((int)(short)((pxVar6->value).decimal.extra << 3) >> 4) +
                        (uVar25 >> 0xe & 0x3f)) * 0x3c + (uVar25 >> 9 & 0x1f) * 0xe10) +
          (pxVar6->value).date.sec <
          (double)(int)((((int)(short)((pxVar5->value).decimal.extra << 3) >> 4) +
                        (uVar12 >> 0xe & 0x3f)) * 0x3c + (uVar12 >> 9 & 0x1f) * 0xe10) +
          (pxVar5->value).date.sec) goto LAB_001c96c1;
      local_38 = xmlSchemaDateNormalize(x,50400.0);
      lVar15 = _xmlSchemaDateCastYMToDays(local_38);
      uVar25 = (local_38->value).hex.total;
      lVar15 = (ulong)(uVar25 >> 4 & 0x1f) + lVar15;
      iVar3 = 0;
      if (lVar7 < lVar15) {
LAB_001c98af:
        iVar3 = 1;
      }
      else {
        bVar26 = true;
        if (lVar15 != lVar7) goto LAB_001c9ca2;
        dVar27 = (double)(int)((((int)(short)((local_38->value).decimal.extra << 3) >> 4) +
                               (uVar25 >> 0xe & 0x3f)) * 0x3c + (uVar25 >> 9 & 0x1f) * 0xe10) +
                 (local_38->value).date.sec;
        uVar25 = (pxVar5->value).hex.total;
        iVar3 = (((int)(short)((pxVar5->value).decimal.extra << 3) >> 4) + (uVar25 >> 0xe & 0x3f)) *
                0x3c + (uVar25 >> 9 & 0x1f) * 0xe10;
LAB_001c9c8c:
        iVar3 = (dVar27 <= (double)iVar3 + (pxVar5->value).date.sec) + 1;
      }
      bVar26 = false;
    }
    else {
      if ((uVar2 & 1) != 0) goto LAB_001c98c8;
      pxVar6 = xmlSchemaDateNormalize(x,0.0);
      lVar7 = _xmlSchemaDateCastYMToDays(pxVar6);
      lVar7 = (ulong)((pxVar6->value).hex.total >> 4 & 0x1f) + lVar7;
      local_40 = xmlSchemaDateNormalize(y,50400.0);
      lVar15 = _xmlSchemaDateCastYMToDays(local_40);
      uVar25 = (local_40->value).hex.total;
      lVar15 = (ulong)(uVar25 >> 4 & 0x1f) + lVar15;
      if (lVar7 < lVar15) goto LAB_001c96c1;
      if (lVar7 != lVar15) goto LAB_001c98b8;
      uVar12 = (pxVar6->value).hex.total;
      if ((double)(int)((((int)(short)((pxVar6->value).decimal.extra << 3) >> 4) +
                        (uVar12 >> 0xe & 0x3f)) * 0x3c + (uVar12 >> 9 & 0x1f) * 0xe10) +
          (pxVar6->value).date.sec <
          (double)(int)((((int)(short)((local_40->value).decimal.extra << 3) >> 4) +
                        (uVar25 >> 0xe & 0x3f)) * 0x3c + (uVar25 >> 9 & 0x1f) * 0xe10) +
          (local_40->value).date.sec) goto LAB_001c96c1;
      pxVar5 = xmlSchemaDateNormalize(y,-50400.0);
      lVar15 = _xmlSchemaDateCastYMToDays(pxVar5);
      uVar25 = (pxVar5->value).hex.total;
      lVar15 = (ulong)(uVar25 >> 4 & 0x1f) + lVar15;
      iVar3 = 0;
      local_38 = pxVar5;
      if (lVar15 < lVar7) goto LAB_001c98af;
      bVar26 = true;
      if (lVar7 == lVar15) {
        uVar12 = (pxVar6->value).hex.total;
        dVar27 = (double)(int)((((int)(short)((pxVar6->value).decimal.extra << 3) >> 4) +
                               (uVar12 >> 0xe & 0x3f)) * 0x3c + (uVar12 >> 9 & 0x1f) * 0xe10) +
                 (pxVar6->value).date.sec;
        iVar3 = (((int)(short)((pxVar5->value).decimal.extra << 3) >> 4) + (uVar25 >> 0xe & 0x3f)) *
                0x3c + (uVar25 >> 9 & 0x1f) * 0xe10;
        goto LAB_001c9c8c;
      }
    }
LAB_001c9ca2:
    xmlSchemaFreeValue(pxVar6);
    xmlSchemaFreeValue(local_40);
    xmlSchemaFreeValue(local_38);
    if (!bVar26) {
      return iVar3;
    }
LAB_001c98c8:
    if (x->type == y->type) {
      pxVar6 = xmlSchemaDateNormalize(y,0.0);
      lVar7 = _xmlSchemaDateCastYMToDays(pxVar6);
      lVar7 = (ulong)((pxVar6->value).hex.total >> 4 & 0x1f) + lVar7;
      pxVar5 = xmlSchemaDateNormalize(x,0.0);
      lVar15 = _xmlSchemaDateCastYMToDays(pxVar5);
      uVar25 = (pxVar5->value).hex.total;
      lVar15 = (ulong)(uVar25 >> 4 & 0x1f) + lVar15;
      iVar3 = -1;
      if ((lVar7 <= lVar15) &&
         ((lVar7 < lVar15 ||
          ((uVar12 = (pxVar6->value).hex.total,
           dVar27 = ((double)(int)((((int)(short)((pxVar5->value).decimal.extra << 3) >> 4) +
                                   (uVar25 >> 0xe & 0x3f)) * 0x3c + (uVar25 >> 9 & 0x1f) * 0xe10) +
                    (pxVar5->value).date.sec) -
                    ((double)(int)((((int)(short)((pxVar6->value).decimal.extra << 3) >> 4) +
                                   (uVar12 >> 0xe & 0x3f)) * 0x3c + (uVar12 >> 9 & 0x1f) * 0xe10) +
                    (pxVar6->value).date.sec), 0.0 <= dVar27 && (iVar3 = 0, 0.0 < dVar27)))))) {
        iVar3 = 1;
      }
      xmlSchemaFreeValue(pxVar5);
      xmlSchemaFreeValue(pxVar6);
      return iVar3;
    }
    uVar20 = x->type - XML_SCHEMAS_TIME;
    uVar12 = 0;
    uVar25 = 0;
    if (uVar20 < 8) {
      uVar25 = *(uint *)(&DAT_001fde50 + (ulong)uVar20 * 4);
    }
    uVar20 = y->type - XML_SCHEMAS_TIME;
    if (uVar20 < 8) {
      uVar12 = *(uint *)(&DAT_001fde50 + (ulong)uVar20 * 4);
    }
    uVar20 = uVar12 ^ uVar25;
    if ((uVar20 & 1) != 0) {
      return 2;
    }
    uVar16 = uVar12 & uVar25;
    if ((uVar16 & 1) != 0) {
      lVar7 = (y->value).date.year;
      lVar15 = (x->value).date.year;
      if (lVar15 < lVar7) {
        return -1;
      }
      if (lVar7 < lVar15) {
        return 1;
      }
    }
    if ((uVar20 & 2) != 0) {
      return 2;
    }
    if ((uVar16 & 2) != 0) {
      uVar21 = (x->value).hex.total & 0xf;
      uVar23 = (y->value).hex.total & 0xf;
      if (uVar21 < uVar23) {
        return -1;
      }
      if (uVar21 >= uVar23 && uVar21 != uVar23) {
        return 1;
      }
    }
    if ((uVar20 & 4) != 0) {
      return 2;
    }
    if ((uVar16 & 4) != 0) {
      uVar20 = (x->value).hex.total >> 4 & 0x1f;
      uVar21 = (y->value).hex.total >> 4 & 0x1f;
      if (uVar20 < uVar21) {
        return -1;
      }
      if (uVar21 < uVar20) {
        return 1;
      }
    }
    if (uVar25 != uVar12) {
      return 2;
    }
    if (7 < uVar16) {
      uVar25 = (x->value).hex.total;
      uVar20 = uVar25 >> 9 & 0x1f;
      uVar12 = (y->value).hex.total;
      uVar16 = uVar12 >> 9 & 0x1f;
      if (uVar20 < uVar16) {
        return -1;
      }
      if (uVar16 < uVar20) {
        return 1;
      }
      uVar25 = uVar25 >> 0xe & 0x3f;
      uVar12 = uVar12 >> 0xe & 0x3f;
      if (uVar25 < uVar12) {
        return -1;
      }
      if (uVar12 < uVar25) {
        return 1;
      }
      dVar27 = (x->value).date.sec;
      dVar28 = (y->value).date.sec;
      if (dVar27 < dVar28) {
        return -1;
      }
      if (dVar28 < dVar27) {
        return 1;
      }
    }
    return 0;
  case XML_SCHEMAS_DURATION:
    if (ytype != XML_SCHEMAS_DURATION) {
      return -2;
    }
    if (x == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if (y == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    dVar27 = (x->value).date.sec - (y->value).date.sec;
    lVar7 = (long)(dVar27 / 86400.0);
    pxVar18 = (x->value).qname.uri + (lVar7 - (y->value).decimal.mi);
    dVar27 = dVar27 - (double)lVar7 * 86400.0;
    uVar14 = (long)(x->value).qname.name - (y->value).decimal.lo;
    if (uVar14 == 0) {
      if (pxVar18 != (xmlChar *)0x0) {
        return (uint)((long)pxVar18 >> 0x3f) | 1;
      }
      if ((dVar27 == 0.0) && (!NAN(dVar27))) {
        return 0;
      }
      return (uint)(0.0 <= dVar27) * 2 + -1;
    }
    if ((long)uVar14 < 1) {
      if (((long)pxVar18 < 1) && (dVar27 <= 0.0)) {
        return -1;
      }
      uVar14 = -uVar14;
      iVar3 = -1;
    }
    else {
      if ((-1 < (long)pxVar18) && (0.0 <= dVar27)) {
        return 1;
      }
      pxVar18 = (xmlChar *)-(long)pxVar18;
      iVar3 = 1;
    }
    lVar15 = 0;
    lVar7 = 0;
    if (0xb < uVar14) {
      if (0x4325c53ef368ebb < uVar14) {
        return -2;
      }
      lVar15 = (uVar14 / 0xc) * 0x16d;
      uVar10 = uVar14 / 0xc + 3 >> 2;
      lVar7 = uVar10 + lVar15;
      lVar15 = uVar10 + lVar15 + -1;
    }
    pxVar24 = (xmlChar *)
              (lVar7 + *(long *)(xmlSchemaCompareDurations_dayRange + (uVar14 % 0xc) * 8 + 0x60));
    if ((pxVar24 ==
         (xmlChar *)(lVar15 + *(long *)(xmlSchemaCompareDurations_dayRange + (uVar14 % 0xc) * 8)))
       && (pxVar24 == pxVar18)) {
      return 0;
    }
    if ((long)pxVar24 < (long)pxVar18) {
      return -iVar3;
    }
    if ((long)pxVar18 < lVar15 + *(long *)(xmlSchemaCompareDurations_dayRange + (uVar14 % 0xc) * 8))
    {
      return iVar3;
    }
    return 2;
  case XML_SCHEMAS_FLOAT:
  case XML_SCHEMAS_DOUBLE:
    if (((ytype - XML_SCHEMAS_FLOAT < 2) && (x != (xmlSchemaValPtr)0x0)) &&
       (y != (xmlSchemaValPtr)0x0)) {
      if (x->type == XML_SCHEMAS_FLOAT) {
        dVar27 = (double)(x->value).f;
      }
      else {
        if (x->type != XML_SCHEMAS_DOUBLE) {
          return -2;
        }
        dVar27 = (x->value).d;
      }
      if (y->type == XML_SCHEMAS_FLOAT) {
        dVar28 = (double)(y->value).f;
      }
      else {
        if (y->type != XML_SCHEMAS_DOUBLE) {
          return -2;
        }
        dVar28 = (y->value).d;
      }
      iVar3 = xmlXPathIsNaN(dVar27);
      iVar4 = xmlXPathIsNaN(dVar28);
      if (iVar3 != 0) {
        return (uint)(iVar4 == 0);
      }
      if (iVar4 != 0) {
        return -1;
      }
      if ((dVar27 == xmlXPathPINF) && (!NAN(dVar27) && !NAN(xmlXPathPINF))) {
        return -(uint)(dVar28 != xmlXPathPINF) & 1;
      }
      if ((dVar28 == xmlXPathPINF) && (!NAN(dVar28) && !NAN(xmlXPathPINF))) {
        return -1;
      }
      if ((dVar27 == xmlXPathNINF) && (!NAN(dVar27) && !NAN(xmlXPathNINF))) {
        return -(uint)(dVar28 != xmlXPathNINF);
      }
      if ((dVar28 == xmlXPathNINF) && (!NAN(dVar28) && !NAN(xmlXPathNINF))) {
        return 1;
      }
      if (dVar27 < dVar28) {
        return -1;
      }
      if (dVar28 < dVar27) {
        return 1;
      }
      uVar25 = -(uint)(dVar27 != dVar28) & 1;
LAB_001c922b:
      return uVar25 * 2;
    }
    break;
  case XML_SCHEMAS_BOOLEAN:
    if ((ytype == XML_SCHEMAS_BOOLEAN) && (x != (xmlSchemaValPtr)0x0)) {
      if (y == (xmlSchemaValPtr)0x0) {
        return -2;
      }
      if ((x->value).b == (y->value).b) {
        return 0;
      }
      bVar26 = (x->value).b == 0;
LAB_001c974b:
      uVar25 = -(uint)bVar26;
LAB_001c97a8:
      return uVar25 | 1;
    }
    break;
  case XML_SCHEMAS_NMTOKENS:
  case XML_SCHEMAS_IDREFS:
  case XML_SCHEMAS_ENTITIES:
    pp_Var8 = __xmlGenericError();
    p_Var17 = *pp_Var8;
    ppvVar9 = __xmlGenericErrorContext();
    pvVar22 = *ppvVar9;
    uVar13 = 0x1383;
LAB_001c9499:
    (*p_Var17)(pvVar22,"Unimplemented block at %s:%d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemastypes.c"
               ,uVar13);
    break;
  case XML_SCHEMAS_QNAME:
  case XML_SCHEMAS_NOTATION:
    if (y != (xmlSchemaValPtr)0x0 && x != (xmlSchemaValPtr)0x0) {
      if ((ytype != XML_SCHEMAS_NOTATION) && (ytype != XML_SCHEMAS_QNAME)) {
        return -2;
      }
      iVar3 = xmlStrEqual((x->value).qname.name,(y->value).qname.name);
      if ((iVar3 != 0) &&
         (iVar3 = xmlStrEqual((x->value).qname.uri,(y->value).qname.uri), iVar3 != 0)) {
        return 0;
      }
      return 2;
    }
    break;
  case XML_SCHEMAS_HEXBINARY:
    if (ytype != XML_SCHEMAS_HEXBINARY) {
      return -2;
    }
    if (x == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if (y == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    uVar25 = (y->value).hex.total;
    uVar12 = (x->value).hex.total;
    if (uVar12 == uVar25) {
      iVar3 = xmlStrcmp((x->value).qname.name,(y->value).qname.name);
      if (0 < iVar3) {
        return 1;
      }
      if (iVar3 != 0) {
        return -1;
      }
      return 0;
    }
    if (uVar12 <= uVar25) {
      return -1;
    }
    return 1;
  case XML_SCHEMAS_BASE64BINARY:
    if ((ytype == XML_SCHEMAS_BASE64BINARY) && (x != (xmlSchemaValPtr)0x0)) {
      if (y == (xmlSchemaValPtr)0x0) {
        return -2;
      }
      uVar25 = (x->value).hex.total;
      uVar12 = (y->value).hex.total;
      if (uVar25 == uVar12) {
        iVar3 = xmlStrcmp((x->value).qname.name,(y->value).qname.name);
        if (iVar3 < 1) {
          return -(uint)(iVar3 != 0);
        }
        return 1;
      }
      bVar26 = uVar12 < uVar25;
LAB_001c97a4:
      uVar25 = bVar26 - 1;
      goto LAB_001c97a8;
    }
    break;
  case XML_SCHEMAS_ANYTYPE:
    break;
  }
  return -2;
}

Assistant:

static int
xmlSchemaCompareValuesInternal(xmlSchemaValType xtype,
			       xmlSchemaValPtr x,
			       const xmlChar *xvalue,
			       xmlSchemaWhitespaceValueType xws,
			       xmlSchemaValType ytype,
			       xmlSchemaValPtr y,
			       const xmlChar *yvalue,
			       xmlSchemaWhitespaceValueType yws)
{
    switch (xtype) {
	case XML_SCHEMAS_UNKNOWN:
	case XML_SCHEMAS_ANYTYPE:
	    return(-2);
        case XML_SCHEMAS_INTEGER:
        case XML_SCHEMAS_NPINTEGER:
        case XML_SCHEMAS_NINTEGER:
        case XML_SCHEMAS_NNINTEGER:
        case XML_SCHEMAS_PINTEGER:
        case XML_SCHEMAS_INT:
        case XML_SCHEMAS_UINT:
        case XML_SCHEMAS_LONG:
        case XML_SCHEMAS_ULONG:
        case XML_SCHEMAS_SHORT:
        case XML_SCHEMAS_USHORT:
        case XML_SCHEMAS_BYTE:
        case XML_SCHEMAS_UBYTE:
	case XML_SCHEMAS_DECIMAL:
	    if ((x == NULL) || (y == NULL))
		return(-2);
	    if (ytype == xtype)
		return(xmlSchemaCompareDecimals(x, y));
	    if ((ytype == XML_SCHEMAS_DECIMAL) ||
		(ytype == XML_SCHEMAS_INTEGER) ||
		(ytype == XML_SCHEMAS_NPINTEGER) ||
		(ytype == XML_SCHEMAS_NINTEGER) ||
		(ytype == XML_SCHEMAS_NNINTEGER) ||
		(ytype == XML_SCHEMAS_PINTEGER) ||
		(ytype == XML_SCHEMAS_INT) ||
		(ytype == XML_SCHEMAS_UINT) ||
		(ytype == XML_SCHEMAS_LONG) ||
		(ytype == XML_SCHEMAS_ULONG) ||
		(ytype == XML_SCHEMAS_SHORT) ||
		(ytype == XML_SCHEMAS_USHORT) ||
		(ytype == XML_SCHEMAS_BYTE) ||
		(ytype == XML_SCHEMAS_UBYTE))
		return(xmlSchemaCompareDecimals(x, y));
	    return(-2);
        case XML_SCHEMAS_DURATION:
	    if ((x == NULL) || (y == NULL))
		return(-2);
	    if (ytype == XML_SCHEMAS_DURATION)
                return(xmlSchemaCompareDurations(x, y));
            return(-2);
        case XML_SCHEMAS_TIME:
        case XML_SCHEMAS_GDAY:
        case XML_SCHEMAS_GMONTH:
        case XML_SCHEMAS_GMONTHDAY:
        case XML_SCHEMAS_GYEAR:
        case XML_SCHEMAS_GYEARMONTH:
        case XML_SCHEMAS_DATE:
        case XML_SCHEMAS_DATETIME:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if ((ytype == XML_SCHEMAS_DATETIME)  ||
                (ytype == XML_SCHEMAS_TIME)      ||
                (ytype == XML_SCHEMAS_GDAY)      ||
                (ytype == XML_SCHEMAS_GMONTH)    ||
                (ytype == XML_SCHEMAS_GMONTHDAY) ||
                (ytype == XML_SCHEMAS_GYEAR)     ||
                (ytype == XML_SCHEMAS_DATE)      ||
                (ytype == XML_SCHEMAS_GYEARMONTH))
                return (xmlSchemaCompareDates(x, y));
            return (-2);
	/*
	* Note that we will support comparison of string types against
	* anySimpleType as well.
	*/
	case XML_SCHEMAS_ANYSIMPLETYPE:
	case XML_SCHEMAS_STRING:
        case XML_SCHEMAS_NORMSTRING:
        case XML_SCHEMAS_TOKEN:
        case XML_SCHEMAS_LANGUAGE:
        case XML_SCHEMAS_NMTOKEN:
        case XML_SCHEMAS_NAME:
        case XML_SCHEMAS_NCNAME:
        case XML_SCHEMAS_ID:
        case XML_SCHEMAS_IDREF:
        case XML_SCHEMAS_ENTITY:
        case XML_SCHEMAS_ANYURI:
	{
	    const xmlChar *xv, *yv;

	    if (x == NULL)
		xv = xvalue;
	    else
		xv = x->value.str;
	    if (y == NULL)
		yv = yvalue;
	    else
		yv = y->value.str;
	    /*
	    * TODO: Compare those against QName.
	    */
	    if (ytype == XML_SCHEMAS_QNAME) {
		TODO
		if (y == NULL)
		    return(-2);
		return (-2);
	    }
            if ((ytype == XML_SCHEMAS_ANYSIMPLETYPE) ||
		(ytype == XML_SCHEMAS_STRING) ||
		(ytype == XML_SCHEMAS_NORMSTRING) ||
                (ytype == XML_SCHEMAS_TOKEN) ||
                (ytype == XML_SCHEMAS_LANGUAGE) ||
                (ytype == XML_SCHEMAS_NMTOKEN) ||
                (ytype == XML_SCHEMAS_NAME) ||
                (ytype == XML_SCHEMAS_NCNAME) ||
                (ytype == XML_SCHEMAS_ID) ||
                (ytype == XML_SCHEMAS_IDREF) ||
                (ytype == XML_SCHEMAS_ENTITY) ||
                (ytype == XML_SCHEMAS_ANYURI)) {

		if (xws == XML_SCHEMA_WHITESPACE_PRESERVE) {

		    if (yws == XML_SCHEMA_WHITESPACE_PRESERVE) {
			/* TODO: What about x < y or x > y. */
			if (xmlStrEqual(xv, yv))
			    return (0);
			else
			    return (2);
		    } else if (yws == XML_SCHEMA_WHITESPACE_REPLACE)
			return (xmlSchemaComparePreserveReplaceStrings(xv, yv, 0));
		    else if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			return (xmlSchemaComparePreserveCollapseStrings(xv, yv, 0));

		} else if (xws == XML_SCHEMA_WHITESPACE_REPLACE) {

		    if (yws == XML_SCHEMA_WHITESPACE_PRESERVE)
			return (xmlSchemaComparePreserveReplaceStrings(yv, xv, 1));
		    if (yws == XML_SCHEMA_WHITESPACE_REPLACE)
			return (xmlSchemaCompareReplacedStrings(xv, yv));
		    if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			return (xmlSchemaCompareReplaceCollapseStrings(xv, yv, 0));

		} else if (xws == XML_SCHEMA_WHITESPACE_COLLAPSE) {

		    if (yws == XML_SCHEMA_WHITESPACE_PRESERVE)
			return (xmlSchemaComparePreserveCollapseStrings(yv, xv, 1));
		    if (yws == XML_SCHEMA_WHITESPACE_REPLACE)
			return (xmlSchemaCompareReplaceCollapseStrings(yv, xv, 1));
		    if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			return (xmlSchemaCompareNormStrings(xv, yv));
		} else
		    return (-2);

	    }
            return (-2);
	}
        case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_NOTATION:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if ((ytype == XML_SCHEMAS_QNAME) ||
		(ytype == XML_SCHEMAS_NOTATION)) {
		if ((xmlStrEqual(x->value.qname.name, y->value.qname.name)) &&
		    (xmlStrEqual(x->value.qname.uri, y->value.qname.uri)))
		    return(0);
		return(2);
	    }
	    return (-2);
        case XML_SCHEMAS_FLOAT:
        case XML_SCHEMAS_DOUBLE:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if ((ytype == XML_SCHEMAS_FLOAT) ||
                (ytype == XML_SCHEMAS_DOUBLE))
                return (xmlSchemaCompareFloats(x, y));
            return (-2);
        case XML_SCHEMAS_BOOLEAN:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if (ytype == XML_SCHEMAS_BOOLEAN) {
		if (x->value.b == y->value.b)
		    return(0);
		if (x->value.b == 0)
		    return(-1);
		return(1);
	    }
	    return (-2);
        case XML_SCHEMAS_HEXBINARY:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if (ytype == XML_SCHEMAS_HEXBINARY) {
	        if (x->value.hex.total == y->value.hex.total) {
		    int ret = xmlStrcmp(x->value.hex.str, y->value.hex.str);
		    if (ret > 0)
			return(1);
		    else if (ret == 0)
			return(0);
		}
		else if (x->value.hex.total > y->value.hex.total)
		    return(1);

		return(-1);
            }
            return (-2);
        case XML_SCHEMAS_BASE64BINARY:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if (ytype == XML_SCHEMAS_BASE64BINARY) {
                if (x->value.base64.total == y->value.base64.total) {
                    int ret = xmlStrcmp(x->value.base64.str,
		                        y->value.base64.str);
                    if (ret > 0)
                        return(1);
                    else if (ret == 0)
                        return(0);
		    else
		        return(-1);
                }
                else if (x->value.base64.total > y->value.base64.total)
                    return(1);
                else
                    return(-1);
            }
            return (-2);
        case XML_SCHEMAS_IDREFS:
        case XML_SCHEMAS_ENTITIES:
        case XML_SCHEMAS_NMTOKENS:
	    TODO
	    break;
    }
    return -2;
}